

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::MenuItem(char *label,char *shortcut,bool selected,bool enabled)

{
  uint uVar1;
  byte in_CL;
  byte in_DL;
  long in_RSI;
  undefined8 in_RDI;
  float _x;
  ImVec2 IVar3;
  float fVar2;
  ImVec2 IVar4;
  ImVec2 *in_stack_00000058;
  ImGuiSelectableFlags in_stack_00000060;
  float extra_w;
  float w_1;
  ImVec2 shortcut_size;
  float w;
  bool pressed;
  ImGuiSelectableFlags flags;
  ImVec2 label_size;
  ImVec2 pos;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  float w2;
  undefined8 in_stack_ffffffffffffff38;
  ImGuiMenuColumns *in_stack_ffffffffffffff40;
  int count;
  undefined8 uVar5;
  float in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined1 hide_text_after_double_hash;
  char *in_stack_ffffffffffffff50;
  ImGuiCol idx;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  ImGuiStyleVar in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff6f;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float fVar6;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  float local_54;
  byte local_4d;
  uint local_4c;
  ImVec2 local_48;
  ImVec2 local_40;
  ImGuiStyle *local_38;
  ImGuiContext *local_30;
  ImGuiWindow *local_28;
  byte local_1a;
  byte local_19;
  long local_18;
  undefined8 local_10;
  bool local_1;
  
  w2 = (float)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  hide_text_after_double_hash = (undefined1)((uint)in_stack_ffffffffffffff4c >> 0x18);
  local_19 = in_DL & 1;
  local_1a = in_CL & 1;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = GetCurrentWindow();
  if ((local_28->SkipItems & 1U) == 0) {
    local_30 = GImGui;
    local_38 = &GImGui->Style;
    local_40 = (local_28->DC).CursorPos;
    local_48 = CalcTextSize((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            in_stack_ffffffffffffff50,(bool)hide_text_after_double_hash,
                            in_stack_ffffffffffffff48);
    local_4c = 8;
    if ((local_1a & 1) != 0) {
      local_4c = 0;
    }
    local_4c = local_4c | 0x1000;
    if ((local_28->DC).LayoutType == 0) {
      local_54 = local_48.x;
      (local_28->DC).CursorPos.x =
           (local_28->DC).CursorPos.x + (float)(int)((local_38->ItemSpacing).x * 0.5);
      local_5c = operator*(in_stack_ffffffffffffff28,0.0);
      count = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
      PushStyleVar(in_stack_ffffffffffffff64,
                   (ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      ImVec2::ImVec2(&local_64,local_54,0.0);
      local_4d = Selectable(_w_1,extra_w._3_1_,in_stack_00000060,in_stack_00000058);
      PopStyleVar(count);
      (local_28->DC).CursorPos.x =
           (float)(int)((local_38->ItemSpacing).x * -0.5) + (local_28->DC).CursorPos.x;
    }
    else {
      if (local_18 == 0) {
        ImVec2::ImVec2(&local_6c,0.0,0.0);
        idx = (ImGuiCol)((ulong)in_stack_ffffffffffffff50 >> 0x20);
      }
      else {
        local_6c = CalcTextSize((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58
                                                ),in_stack_ffffffffffffff50,
                                (bool)hide_text_after_double_hash,in_stack_ffffffffffffff48);
        idx = (ImGuiCol)((ulong)in_stack_ffffffffffffff50 >> 0x20);
      }
      _x = ImGuiMenuColumns::DeclColumns
                     (in_stack_ffffffffffffff40,(float)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                      (float)in_stack_ffffffffffffff38,w2);
      IVar3 = GetContentRegionAvail();
      fVar6 = IVar3.x;
      fVar2 = ImMax<float>(0.0,fVar6 - _x);
      uVar1 = local_4c | 0x2000;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff7c,_x,0.0);
      local_4d = Selectable(_w_1,extra_w._3_1_,in_stack_00000060,in_stack_00000058);
      uVar5 = local_10;
      if (0.0 < local_6c.x) {
        PushStyleColor(idx,(ImVec4 *)CONCAT44(uVar1,in_stack_ffffffffffffff48));
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff6c,(local_28->MenuColumns).Pos[1] + fVar2,0.0
                      );
        IVar4 = operator+(in_stack_ffffffffffffff28,(ImVec2 *)0x19530d);
        in_stack_ffffffffffffff78 = IVar4.y;
        IVar3.y = fVar6;
        IVar3.x = in_stack_ffffffffffffff80;
        RenderText(IVar3,(char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (char *)CONCAT44(IVar4.x,in_stack_ffffffffffffff70),
                   (bool)in_stack_ffffffffffffff6f);
        PopStyleColor((int)w2);
        uVar5 = local_10;
      }
      if ((local_19 & 1) != 0) {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff5c,
                       local_30->FontSize * 0.4 + (local_28->MenuColumns).Pos[2] + fVar2,
                       local_30->FontSize * 0.134 * 0.5);
        operator+(in_stack_ffffffffffffff28,(ImVec2 *)0x1953b8);
        GetColorU32((ImGuiCol)((ulong)uVar5 >> 0x20),(float)uVar5);
        IVar4.y = fVar6;
        IVar4.x = in_stack_ffffffffffffff80;
        RenderCheckMark(IVar4,(ImU32)in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      }
    }
    local_1 = (bool)(local_4d & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::MenuItem(const char* label, const char* shortcut, bool selected, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 pos = window->DC.CursorPos;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    ImGuiSelectableFlags flags = ImGuiSelectableFlags_PressedOnRelease | (enabled ? 0 : ImGuiSelectableFlags_Disabled);
    bool pressed;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Mimic the exact layout spacing of BeginMenu() to allow MenuItem() inside a menu bar, which is a little misleading but may be useful
        // Note that in this situation we render neither the shortcut neither the selected tick mark
        float w = label_size.x;
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, style.ItemSpacing * 2.0f);
        pressed = Selectable(label, false, flags, ImVec2(w, 0.0f));
        PopStyleVar();
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        ImVec2 shortcut_size = shortcut ? CalcTextSize(shortcut, NULL) : ImVec2(0.0f, 0.0f);
        float w = window->MenuColumns.DeclColumns(label_size.x, shortcut_size.x, (float)(int)(g.FontSize * 1.20f)); // Feedback for next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - w);
        pressed = Selectable(label, false, flags | ImGuiSelectableFlags_DrawFillAvailWidth, ImVec2(w, 0.0f));
        if (shortcut_size.x > 0.0f)
        {
            PushStyleColor(ImGuiCol_Text, g.Style.Colors[ImGuiCol_TextDisabled]);
            RenderText(pos + ImVec2(window->MenuColumns.Pos[1] + extra_w, 0.0f), shortcut, NULL, false);
            PopStyleColor();
        }
        if (selected)
            RenderCheckMark(pos + ImVec2(window->MenuColumns.Pos[2] + extra_w + g.FontSize * 0.40f, g.FontSize * 0.134f * 0.5f), GetColorU32(enabled ? ImGuiCol_Text : ImGuiCol_TextDisabled), g.FontSize  * 0.866f);
    }

    IMGUI_TEST_ENGINE_ITEM_INFO(window->DC.LastItemId, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Checkable | (selected ? ImGuiItemStatusFlags_Checked : 0));
    return pressed;
}